

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::set<int,std::less<int>,std::allocator<int>>&,std::map<char,std::__cxx11::string,std::less<char>,std::allocator<std::pair<char_const,std::__cxx11::string>>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          set<int,_std::less<int>,_std::allocator<int>_> *args,
          map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args_1)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  QueueWriter *this_00;
  char **ppcVar3;
  undefined4 uVar4;
  _Base_ptr p_Var5;
  Queue *pQVar6;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  
  p_Var7 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  puVar10 = (undefined1 *)0x4;
  lVar9 = 4;
  while ((_Rb_tree_header *)p_Var7 != &(args->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    lVar9 = lVar9 + 4;
  }
  p_Var7 = (args_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(args_1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    puVar10 = (undefined1 *)0x0;
    do {
      puVar11 = puVar10;
      p_Var5 = p_Var7[1]._M_left;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      puVar10 = &p_Var5->field_0x5 + (long)puVar11;
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    puVar10 = (undefined1 *)((long)&p_Var5->_M_parent + (long)(puVar11 + 1));
  }
  pcVar2 = puVar10 + lVar9 + 0x10 + 4;
  this_00 = &this->_qw;
  if (((((this->_qw)._writeEnd + -(long)(this->_qw)._writePos < pcVar2) &&
       (pcVar8 = (char *)detail::QueueWriter::maximizeWriteCapacity(this_00), pcVar8 < pcVar2)) &&
      (replaceChannel(this,(size_t)pcVar2),
      (this->_qw)._writeEnd + -(long)(this->_qw)._writePos < pcVar2)) &&
     (pcVar8 = (char *)detail::QueueWriter::maximizeWriteCapacity(this_00), pcVar8 < pcVar2)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(puVar10 + lVar9 + 0x10);
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  *(uint64_t *)(pcVar2 + 4) = eventSourceId;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(uint64_t *)(pcVar2 + 8) = clock;
  ppcVar3 = &(this->_qw)._writePos;
  *ppcVar3 = *ppcVar3 + 8;
  mserialize::detail::BuiltinSerializer<std::set<int,_std::less<int>,_std::allocator<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  uVar4 = (undefined4)(args_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(this->_qw)._writePos = uVar4;
  ppcVar3 = &(this->_qw)._writePos;
  *ppcVar3 = *ppcVar3 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_1,uVar4,this_00);
  pQVar6 = (this->_qw)._queue;
  (pQVar6->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar6->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}